

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O0

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,ClassDeclarationSyntax *syntax)

{
  vector<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  
  std::
  vector<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ::push_back(in_RDI,in_stack_ffffffffffffffd8);
  slang::syntax::SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor>::
  visitDefault<slang::syntax::ClassDeclarationSyntax_const&>
            ((SyntaxVisitor<slang::parsing::(anonymous_namespace)::MetadataVisitor> *)this,syntax);
  return;
}

Assistant:

void handle(const ClassDeclarationSyntax& syntax) {
        meta.classDecls.push_back(&syntax);
        visitDefault(syntax);
    }